

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompOpEvalToBoolean(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,int isPredicate)

{
  xmlXPathOp xVar1;
  xmlXPathObjectPtr *ppxVar2;
  int iVar3;
  uint uVar4;
  xmlXPathObjectPtr pxVar5;
  
  while( true ) {
    if ((ctxt->context->opLimit != 0) && (iVar3 = xmlXPathCheckOpLimit(ctxt,1), iVar3 < 0)) {
      return 0;
    }
    xVar1 = op->op;
    if (xVar1 != XPATH_OP_SORT) break;
    if ((long)op->ch1 == -1) {
      return 0;
    }
    op = ctxt->comp->steps + op->ch1;
  }
  if (xVar1 == XPATH_OP_END) {
    return 0;
  }
  if (xVar1 == XPATH_OP_COLLECT) {
    if ((long)op->ch1 == -1) {
      return 0;
    }
    xmlXPathCompOpEval(ctxt,ctxt->comp->steps + op->ch1);
    if (ctxt->error != 0) {
      return -1;
    }
    xmlXPathNodeCollectAndTest(ctxt,op,(xmlNodePtr *)0x0,(xmlNodePtr *)0x0,1);
  }
  else {
    if (xVar1 == XPATH_OP_VALUE) {
      if (isPredicate == 0) {
        iVar3 = xmlXPathCastToBoolean((xmlXPathObjectPtr)op->value4);
        return iVar3;
      }
      iVar3 = xmlXPathEvaluatePredicateResult(ctxt,(xmlXPathObjectPtr)op->value4);
      return iVar3;
    }
    xmlXPathCompOpEval(ctxt,op);
  }
  if (ctxt->error != 0) {
    return -1;
  }
  iVar3 = ctxt->valueNr;
  if (0 < (long)iVar3) {
    uVar4 = iVar3 - 1;
    ctxt->valueNr = uVar4;
    ppxVar2 = ctxt->valueTab;
    if (iVar3 == 1) {
      pxVar5 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar5 = ppxVar2[(long)iVar3 + -2];
    }
    ctxt->value = pxVar5;
    pxVar5 = ppxVar2[uVar4];
    ppxVar2[uVar4] = (xmlXPathObjectPtr)0x0;
    if (pxVar5 != (xmlXPathObjectPtr)0x0) {
      if (pxVar5->type == XPATH_BOOLEAN) {
        iVar3 = pxVar5->boolval;
      }
      else if (isPredicate == 0) {
        iVar3 = xmlXPathCastToBoolean(pxVar5);
      }
      else {
        iVar3 = xmlXPathEvaluatePredicateResult(ctxt,pxVar5);
      }
      xmlXPathReleaseObject(ctxt->context,pxVar5);
      return iVar3;
    }
    return -1;
  }
  return -1;
}

Assistant:

static int
xmlXPathCompOpEvalToBoolean(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    int isPredicate)
{
    xmlXPathObjectPtr resObj = NULL;

start:
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    /* comp = ctxt->comp; */
    switch (op->op) {
        case XPATH_OP_END:
            return (0);
	case XPATH_OP_VALUE:
	    resObj = (xmlXPathObjectPtr) op->value4;
	    if (isPredicate)
		return(xmlXPathEvaluatePredicateResult(ctxt, resObj));
	    return(xmlXPathCastToBoolean(resObj));
	case XPATH_OP_SORT:
	    /*
	    * We don't need sorting for boolean results. Skip this one.
	    */
            if (op->ch1 != -1) {
		op = &ctxt->comp->steps[op->ch1];
		goto start;
	    }
	    return(0);
	case XPATH_OP_COLLECT:
	    if (op->ch1 == -1)
		return(0);

            xmlXPathCompOpEval(ctxt, &ctxt->comp->steps[op->ch1]);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

            xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 1);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

	    resObj = valuePop(ctxt);
	    if (resObj == NULL)
		return(-1);
	    break;
	default:
	    /*
	    * Fallback to call xmlXPathCompOpEval().
	    */
	    xmlXPathCompOpEval(ctxt, op);
	    if (ctxt->error != XPATH_EXPRESSION_OK)
		return(-1);

	    resObj = valuePop(ctxt);
	    if (resObj == NULL)
		return(-1);
	    break;
    }

    if (resObj) {
	int res;

	if (resObj->type == XPATH_BOOLEAN) {
	    res = resObj->boolval;
	} else if (isPredicate) {
	    /*
	    * For predicates a result of type "number" is handled
	    * differently:
	    * SPEC XPath 1.0:
	    * "If the result is a number, the result will be converted
	    *  to true if the number is equal to the context position
	    *  and will be converted to false otherwise;"
	    */
	    res = xmlXPathEvaluatePredicateResult(ctxt, resObj);
	} else {
	    res = xmlXPathCastToBoolean(resObj);
	}
	xmlXPathReleaseObject(ctxt->context, resObj);
	return(res);
    }

    return(0);
}